

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZEncoder.cpp
# Opt level: O2

EncodeResult *
ZXing::Aztec::Encoder::Encode
          (EncodeResult *__return_storage_ptr__,string *data,int minECCPercent,
          int userSpecifiedLayers)

{
  BitMatrix *this;
  int iVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  pointer piVar8;
  long lVar9;
  invalid_argument *piVar10;
  pointer puVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  pointer puVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  int k_1;
  uint uVar19;
  ulong uVar20;
  int k;
  int iVar21;
  long lVar22;
  bool bVar23;
  uint local_188;
  long local_180;
  allocator_type local_169;
  ulong local_168;
  uint local_15c;
  BitArray stuffedBits;
  vector<int,_std::allocator<int>_> alignmentMap;
  BitArray modeMessage;
  value_type_conflict3 local_6c;
  BitArray messageBits;
  BitArray bits;
  
  HighLevelEncoder::Encode(&bits,data);
  iVar4 = (minECCPercent *
          ((int)bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (int)bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start)) / 100;
  iVar12 = iVar4 + 0xb;
  stuffedBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stuffedBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stuffedBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (userSpecifiedLayers == 0) {
    puVar11 = (pointer)0x0;
    puVar15 = (pointer)0x0;
    iVar5 = 0;
    uVar17 = 0;
    do {
      do {
        uVar7 = uVar17;
        if (uVar7 == 0x21) {
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar10,"Data too large for an Aztec code");
          __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        uVar17 = uVar7 + 1;
        uVar19 = uVar7;
        if (uVar7 < 4) {
          uVar19 = uVar17;
        }
        uVar20 = (ulong)uVar19;
        bVar23 = uVar7 < 4;
        iVar21 = uVar19 * 0x10 + 0x70;
        if (bVar23) {
          iVar21 = uVar19 * 0x10 + 0x58;
        }
        iVar21 = iVar21 * uVar19;
      } while (iVar21 < iVar4 + ((int)bits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)bits._bits.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) + 0xb);
      iVar6 = *(int *)(WORD_SIZE + uVar20 * 4);
      if (iVar5 != iVar6) {
        StuffBits(&bits,iVar6,&stuffedBits);
        puVar11 = stuffedBits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar15 = stuffedBits._bits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar5 = iVar6;
      }
      iVar6 = (int)puVar15 - (int)puVar11;
    } while ((uVar7 < 4 && iVar5 * 0x40 < iVar6) || (iVar21 - iVar21 % iVar5 < iVar6 + iVar12));
  }
  else {
    uVar20 = (ulong)(uint)-userSpecifiedLayers;
    if (0 < userSpecifiedLayers) {
      uVar20 = (ulong)(uint)userSpecifiedLayers;
    }
    uVar17 = 0x20;
    if (userSpecifiedLayers < 0) {
      uVar17 = 4;
    }
    uVar7 = (uint)uVar20;
    if (uVar17 < uVar7) {
      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string((string *)&messageBits,userSpecifiedLayers);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &alignmentMap,"Illegal value for layers: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &messageBits);
      std::invalid_argument::invalid_argument(piVar10,(string *)&alignmentMap);
      __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar21 = uVar7 * 0x10 + 0x58;
    if (-1 < userSpecifiedLayers) {
      iVar21 = uVar7 * 0x10 + 0x70;
    }
    iVar5 = *(int *)(WORD_SIZE + uVar20 * 4);
    StuffBits(&bits,iVar5,&stuffedBits);
    iVar21 = iVar21 * uVar7;
    if (iVar21 - iVar21 % iVar5 <
        iVar12 + ((int)stuffedBits._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (int)stuffedBits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start)) {
      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar10,"Data to large for user specified layer");
LAB_00160cec:
      __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    if (userSpecifiedLayers < 0) {
      bVar23 = true;
      if (iVar5 * 0x40 <
          (int)stuffedBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
          (int)stuffedBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar10,"Data to large for user specified layer");
        goto LAB_00160cec;
      }
    }
    else {
      bVar23 = false;
    }
  }
  messageBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  messageBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  messageBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenerateCheckWords(&stuffedBits,iVar21,iVar5,&messageBits);
  iVar21 = ((int)stuffedBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (int)stuffedBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start) / iVar5;
  modeMessage._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  modeMessage._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  modeMessage._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&modeMessage._bits,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&alignmentMap,
             (long)((int)stuffedBits._bits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (int)stuffedBits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start) % (long)iVar5 & 0xffffffff);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&alignmentMap);
  iVar4 = (int)uVar20;
  bVar2 = bVar23 ^ 1;
  iVar12 = 0x28;
  if (bVar23 != false) {
    iVar12 = 0x1c;
  }
  BitArray::appendBits(&modeMessage,iVar4 + -1,(uint)bVar2 + (uint)bVar2 * 2 + 2);
  BitArray::appendBits(&modeMessage,iVar21 + -1,(uint)bVar2 + (uint)bVar2 * 4 + 6);
  GenerateCheckWords(&modeMessage,iVar12,4,&modeMessage);
  local_168 = (ulong)((uint)bVar2 + (uint)bVar2 * 2 + iVar4 * 4 + 0xb);
  local_6c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&alignmentMap,local_168,&local_6c,&local_169);
  local_15c = (uint)local_168;
  if (bVar23 == false) {
    uVar7 = (uint)(local_168 >> 1) & 0x7f;
    local_15c = local_15c + (byte)((char)(((short)uVar7 - 1U & 0xff) / 0xf) * '\x02') + 1;
    uVar17 = local_15c >> 1 & 0x7f;
    iVar12 = uVar17 + 1;
    lVar18 = -4;
    uVar13 = 0;
    while( true ) {
      uVar17 = uVar17 - 1;
      if (uVar7 == uVar13) break;
      iVar5 = (int)((uVar13 & 0xffffffff) / 0xf);
      *(uint *)((long)alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar18 + (ulong)(uVar7 << 2)) =
           uVar17 - iVar5;
      *(int *)((long)alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar13 * 4 + (ulong)(uVar7 << 2)) =
           iVar12 + iVar5 + (int)uVar13;
      uVar13 = uVar13 + 1;
      lVar18 = lVar18 + -4;
    }
  }
  else {
    iVar12 = 0;
    for (piVar8 = alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar8 != alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar8 = piVar8 + 1) {
      *piVar8 = iVar12;
      iVar12 = iVar12 + 1;
    }
  }
  __return_storage_ptr__->compact = bVar23;
  __return_storage_ptr__->size = local_15c;
  __return_storage_ptr__->layers = iVar4;
  __return_storage_ptr__->codeWords = iVar21;
  this = &__return_storage_ptr__->matrix;
  BitMatrix::BitMatrix(this,local_15c);
  iVar5 = (uint)bVar2 + (uint)bVar2 * 2 + iVar4 * 4 + 10;
  local_180 = 0;
  iVar12 = 0;
  for (uVar13 = 0; uVar13 != uVar20; uVar13 = uVar13 + 1) {
    lVar18 = (ulong)bVar2 * 3 + 9 + ((long)iVar4 - uVar13) * 4;
    iVar21 = (int)lVar18;
    iVar6 = ~(uint)(uVar13 * 2) + (uint)local_168;
    for (lVar16 = 0; lVar16 < lVar18; lVar16 = lVar16 + 1) {
      iVar1 = (int)lVar16;
      local_188 = iVar12 + iVar1 * 2;
      lVar9 = uVar13 * 2 + lVar16;
      lVar14 = (long)iVar5;
      for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
        uVar17 = (uint)lVar22;
        bVar3 = BitArray::get(&messageBits,uVar17 | local_188);
        if (bVar3) {
          BitMatrix::set(this,*(int *)((long)alignmentMap.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start +
                                      lVar22 * 4 + local_180),
                         alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9],true);
        }
        bVar3 = BitArray::get(&messageBits,iVar12 + iVar21 * 2 + iVar1 * 2 | uVar17);
        if (bVar3) {
          BitMatrix::set(this,alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar9],
                         alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)lVar14],true);
        }
        bVar3 = BitArray::get(&messageBits,iVar12 + iVar21 * 4 + iVar1 * 2 | uVar17);
        if (bVar3) {
          BitMatrix::set(this,alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar14],
                         alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar6 - lVar16],true);
        }
        bVar3 = BitArray::get(&messageBits,iVar21 * 6 + iVar12 + iVar1 * 2 | uVar17);
        if (bVar3) {
          BitMatrix::set(this,alignmentMap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar6 - iVar1],
                         *(int *)((long)alignmentMap.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start +
                                 lVar22 * 4 + local_180),true);
        }
        lVar14 = lVar14 + -1;
      }
    }
    iVar12 = iVar12 + iVar21 * 8;
    iVar5 = iVar5 + -2;
    local_180 = local_180 + 8;
  }
  uVar17 = (int)local_15c / 2;
  if (bVar23 == false) {
    iVar4 = uVar17 - 5;
    uVar7 = 0;
    for (iVar12 = 0x27; iVar12 != 0x1d; iVar12 = iVar12 + -1) {
      iVar5 = (iVar4 + 1) - (uint)(uVar7 < 5);
      bVar3 = BitArray::get(&modeMessage,uVar7);
      if (bVar3) {
        BitMatrix::set(this,iVar5,uVar17 - 7,true);
      }
      bVar3 = BitArray::get(&modeMessage,uVar7 + 10);
      if (bVar3) {
        BitMatrix::set(this,uVar17 + 7,iVar5,true);
      }
      bVar3 = BitArray::get(&modeMessage,iVar12 + -10);
      if (bVar3) {
        BitMatrix::set(this,iVar5,uVar17 + 7,true);
      }
      bVar3 = BitArray::get(&modeMessage,iVar12);
      if (bVar3) {
        BitMatrix::set(this,uVar17 - 7,iVar5,true);
      }
      uVar7 = uVar7 + 1;
      iVar4 = iVar4 + 1;
    }
  }
  else {
    iVar4 = uVar17 - 3;
    iVar5 = 0;
    for (iVar12 = 0x14; iVar12 != 0xd; iVar12 = iVar12 + -1) {
      bVar3 = BitArray::get(&modeMessage,iVar5);
      if (bVar3) {
        BitMatrix::set(this,iVar4,uVar17 - 5,true);
      }
      bVar3 = BitArray::get(&modeMessage,iVar5 + 7);
      if (bVar3) {
        BitMatrix::set(this,uVar17 + 5,iVar4,true);
      }
      bVar3 = BitArray::get(&modeMessage,iVar12);
      if (bVar3) {
        BitMatrix::set(this,iVar4,uVar17 + 5,true);
      }
      bVar3 = BitArray::get(&modeMessage,iVar12 + 7);
      if (bVar3) {
        BitMatrix::set(this,uVar17 - 5,iVar4,true);
      }
      iVar5 = iVar5 + 1;
      iVar4 = iVar4 + 1;
    }
  }
  if (bVar23 == false) {
    DrawBullsEye(this,uVar17,7);
    local_168 = (ulong)(((uint)(local_168 >> 1) & 0x7fffffff) - 1);
    local_180._0_4_ = uVar17 & 1;
    iVar12 = 0;
    for (uVar7 = 0; uVar7 < (uint)local_168; uVar7 = uVar7 + 0xf) {
      for (uVar19 = (uint)local_180; (int)uVar19 < (int)local_15c; uVar19 = uVar19 + 2) {
        BitMatrix::set(this,uVar17 - iVar12,uVar19,true);
        BitMatrix::set(this,iVar12 + uVar17,uVar19,true);
        BitMatrix::set(this,uVar19,uVar17 - iVar12,true);
        BitMatrix::set(this,uVar19,iVar12 + uVar17,true);
      }
      iVar12 = iVar12 + 0x10;
    }
  }
  else {
    DrawBullsEye(this,uVar17,5);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&alignmentMap.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&modeMessage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&messageBits);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stuffedBits);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bits);
  return __return_storage_ptr__;
}

Assistant:

EncodeResult
Encoder::Encode(const std::string& data, int minECCPercent, int userSpecifiedLayers)
{
	// High-level encode
	BitArray bits = HighLevelEncoder::Encode(data);

	// stuff bits and choose symbol size
	int eccBits = bits.size() * minECCPercent / 100 + 11;
	int totalSizeBits = bits.size() + eccBits;
	bool compact;
	int layers;
	int totalBitsInLayer;
	int wordSize;
	BitArray stuffedBits;
	if (userSpecifiedLayers != DEFAULT_AZTEC_LAYERS) {
		compact = userSpecifiedLayers < 0;
		layers = std::abs(userSpecifiedLayers);
		if (layers > (compact ? MAX_NB_BITS_COMPACT : MAX_NB_BITS)) {
			throw std::invalid_argument("Illegal value for layers: " + std::to_string(userSpecifiedLayers));
		}
		totalBitsInLayer = TotalBitsInLayer(layers, compact);
		wordSize = WORD_SIZE[layers];
		int usableBitsInLayers = totalBitsInLayer - (totalBitsInLayer % wordSize);
		StuffBits(bits, wordSize, stuffedBits);
		if (stuffedBits.size() + eccBits > usableBitsInLayers) {
			throw std::invalid_argument("Data to large for user specified layer");
		}
		if (compact && stuffedBits.size() > wordSize * 64) {
			// Compact format only allows 64 data words, though C4 can hold more words than that
			throw std::invalid_argument("Data to large for user specified layer");
		}
	}
	else {
		wordSize = 0;
		// We look at the possible table sizes in the order Compact1, Compact2, Compact3,
		// Compact4, Normal4,...  Normal(i) for i < 4 isn't typically used since Compact(i+1)
		// is the same size, but has more data.
		for (int i = 0; ; i++) {
			if (i > MAX_NB_BITS) {
				throw std::invalid_argument("Data too large for an Aztec code");
			}
			compact = i <= 3;
			layers = compact ? i + 1 : i;
			totalBitsInLayer = TotalBitsInLayer(layers, compact);
			if (totalSizeBits > totalBitsInLayer) {
				continue;
			}
			// [Re]stuff the bits if this is the first opportunity, or if the
			// wordSize has changed
			if (wordSize != WORD_SIZE[layers]) {
				wordSize = WORD_SIZE[layers];
				StuffBits(bits, wordSize, stuffedBits);
			}
			int usableBitsInLayers = totalBitsInLayer - (totalBitsInLayer % wordSize);
			if (compact && stuffedBits.size() > wordSize * 64) {
				// Compact format only allows 64 data words, though C4 can hold more words than that
				continue;
			}
			if (stuffedBits.size() + eccBits <= usableBitsInLayers) {
				break;
			}
		}
	}
	BitArray messageBits;
	GenerateCheckWords(stuffedBits, totalBitsInLayer, wordSize, messageBits);

	// generate mode message
	int messageSizeInWords = stuffedBits.size() / wordSize;
	BitArray modeMessage;
	GenerateModeMessage(compact, layers, messageSizeInWords, modeMessage);

	// allocate symbol
	int baseMatrixSize = (compact ? 11 : 14) + layers * 4; // not including alignment lines
	std::vector<int> alignmentMap(baseMatrixSize, 0);
	int matrixSize;
	if (compact) {
		// no alignment marks in compact mode, alignmentMap is a no-op
		matrixSize = baseMatrixSize;
		std::iota(alignmentMap.begin(), alignmentMap.end(), 0);
	}
	else {
		matrixSize = baseMatrixSize + 1 + 2 * ((baseMatrixSize / 2 - 1) / 15);
		int origCenter = baseMatrixSize / 2;
		int center = matrixSize / 2;
		for (int i = 0; i < origCenter; i++) {
			int newOffset = i + i / 15;
			alignmentMap[origCenter - i - 1] = center - newOffset - 1;
			alignmentMap[origCenter + i] = center + newOffset + 1;
		}
	}

	EncodeResult output{compact, matrixSize, layers, messageSizeInWords, BitMatrix(matrixSize)};

	BitMatrix& matrix = output.matrix;

	// draw data bits
	for (int i = 0, rowOffset = 0; i < layers; i++) {
		int rowSize = (layers - i) * 4 + (compact ? 9 : 12);
		for (int j = 0; j < rowSize; j++) {
			int columnOffset = j * 2;
			for (int k = 0; k < 2; k++) {
				if (messageBits.get(rowOffset + columnOffset + k)) {
					matrix.set(alignmentMap[i * 2 + k], alignmentMap[i * 2 + j]);
				}
				if (messageBits.get(rowOffset + rowSize * 2 + columnOffset + k)) {
					matrix.set(alignmentMap[i * 2 + j], alignmentMap[baseMatrixSize - 1 - i * 2 - k]);
				}
				if (messageBits.get(rowOffset + rowSize * 4 + columnOffset + k)) {
					matrix.set(alignmentMap[baseMatrixSize - 1 - i * 2 - k], alignmentMap[baseMatrixSize - 1 - i * 2 - j]);
				}
				if (messageBits.get(rowOffset + rowSize * 6 + columnOffset + k)) {
					matrix.set(alignmentMap[baseMatrixSize - 1 - i * 2 - j], alignmentMap[i * 2 + k]);
				}
			}
		}
		rowOffset += rowSize * 8;
	}

	// draw mode message
	DrawModeMessage(matrix, compact, matrixSize, modeMessage);

	// draw alignment marks
	if (compact) {
		DrawBullsEye(matrix, matrixSize / 2, 5);
	}
	else {
		DrawBullsEye(matrix, matrixSize / 2, 7);
		for (int i = 0, j = 0; i < baseMatrixSize / 2 - 1; i += 15, j += 16) {
			for (int k = (matrixSize / 2) & 1; k < matrixSize; k += 2) {
				matrix.set(matrixSize / 2 - j, k);
				matrix.set(matrixSize / 2 + j, k);
				matrix.set(k, matrixSize / 2 - j);
				matrix.set(k, matrixSize / 2 + j);
			}
		}
	}
	return output;
}